

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

void do_combine(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  
  if ((ch->comm[0] & 0x4000) == 0) {
    send_to_char("Combined inventory selected.\n\r",ch);
    uVar1 = ch->comm[0] | 0x4000;
  }
  else {
    send_to_char("Long inventory selected.\n\r",ch);
    uVar1 = ch->comm[0] & 0xffffffffffffbfff;
  }
  ch->comm[0] = uVar1;
  return;
}

Assistant:

void do_combine(CHAR_DATA *ch, char *argument)
{
	if (IS_SET(ch->comm, COMM_COMBINE))
	{
		send_to_char("Long inventory selected.\n\r", ch);
		REMOVE_BIT(ch->comm, COMM_COMBINE);
	}
	else
	{
		send_to_char("Combined inventory selected.\n\r", ch);
		SET_BIT(ch->comm, COMM_COMBINE);
	}
}